

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O3

bool cmSystemTools::RunSingleCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *command,string *captureStdOut,string *captureStdErr,int *retVal,char *dir,
               OutputOption outputflag,double timeout,Encoding encoding)

{
  pointer pcVar1;
  int iVar2;
  cmsysProcess *cp;
  undefined4 extraout_var;
  undefined8 extraout_RAX;
  char *pcVar4;
  size_t sVar5;
  long lVar6;
  pointer pbVar7;
  bool bVar8;
  cmProcessOutput processOutput;
  int length;
  char *data;
  string strdata;
  vector<const_char_*,_std::allocator<const_char_*>_> argv;
  vector<char,_std::allocator<char>_> tempStdErr;
  vector<char,_std::allocator<char>_> tempStdOut;
  cmProcessOutput local_151;
  undefined8 local_150;
  int local_144;
  char *local_140;
  string local_138;
  char **local_118;
  iterator iStack_110;
  char **local_108;
  string *local_100;
  void *local_f8;
  undefined8 uStack_f0;
  long local_e8;
  void *local_d8;
  undefined8 uStack_d0;
  long local_c8;
  char *local_c0;
  int *local_b8;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  undefined8 uVar3;
  
  local_118 = (char **)0x0;
  iStack_110._M_current = (char **)0x0;
  local_108 = (char **)0x0;
  pbVar7 = (command->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_100 = (string *)timeout;
  local_b8 = retVal;
  if (pbVar7 == (command->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
LAB_0026f209:
    local_138._M_dataplus._M_p = (pointer)0x0;
    std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
              ((vector<char_const*,std::allocator<char_const*>> *)&local_118,iStack_110,
               (char **)&local_138);
  }
  else {
    local_150 = CONCAT44(local_150._4_4_,outputflag);
    local_c0 = dir;
    do {
      local_138._M_dataplus._M_p = (pbVar7->_M_dataplus)._M_p;
      if (iStack_110._M_current == local_108) {
        std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
                  ((vector<char_const*,std::allocator<char_const*>> *)&local_118,iStack_110,
                   (char **)&local_138);
      }
      else {
        *iStack_110._M_current = local_138._M_dataplus._M_p;
        iStack_110._M_current = iStack_110._M_current + 1;
      }
      pbVar7 = pbVar7 + 1;
    } while (pbVar7 != (command->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish);
    local_138._M_dataplus._M_p = (pointer)0x0;
    dir = local_c0;
    outputflag = (OutputOption)local_150;
    if (iStack_110._M_current == local_108) goto LAB_0026f209;
    *iStack_110._M_current = (char *)0x0;
    iStack_110._M_current = iStack_110._M_current + 1;
  }
  cp = cmsysProcess_New();
  cmsysProcess_SetCommand(cp,local_118);
  iVar2 = cmsysProcess_SetWorkingDirectory(cp,dir);
  uVar3 = CONCAT44(extraout_var,iVar2);
  if (s_RunCommandHideConsole == true) {
    cmsysProcess_SetOption(cp,0,1);
    uVar3 = extraout_RAX;
  }
  if (outputflag == OUTPUT_MERGE) {
LAB_0026f29e:
    cmsysProcess_SetOption(cp,2,1);
LAB_0026f2b9:
    local_150 = 0;
    captureStdErr = (string *)0x0;
  }
  else {
    if (outputflag == OUTPUT_PASSTHROUGH) {
      cmsysProcess_SetPipeShared(cp,2,1);
      cmsysProcess_SetPipeShared(cp,3,1);
      captureStdOut = (string *)0x0;
      goto LAB_0026f2b9;
    }
    if (captureStdErr == (string *)0x0) goto LAB_0026f2b9;
    local_150 = CONCAT71((int7)((ulong)uVar3 >> 8),1);
    if (captureStdErr == captureStdOut) goto LAB_0026f29e;
  }
  cmsysProcess_SetTimeout(cp,(double)local_100);
  cmsysProcess_Execute(cp);
  local_d8 = (void *)0x0;
  uStack_d0 = 0;
  local_c8 = 0;
  local_e8 = 0;
  local_f8 = (void *)0x0;
  uStack_f0 = 0;
  cmProcessOutput::cmProcessOutput(&local_151,encoding,0x400);
  local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  local_138._M_string_length = 0;
  local_138.field_2._M_local_buf[0] = '\0';
  if ((outputflag != OUTPUT_PASSTHROUGH) &&
     ((outputflag == OUTPUT_NONE & ~(byte)local_150 & captureStdOut == (string *)0x0) == 0)) {
    local_100 = captureStdErr;
    while (iVar2 = cmsysProcess_WaitForData(cp,&local_140,&local_144,(double *)0x0),
          captureStdErr = local_100, 0 < iVar2) {
      if (0 < local_144) {
        lVar6 = 0;
        do {
          if (local_140[lVar6] == '\0') {
            local_140[lVar6] = ' ';
          }
          lVar6 = lVar6 + 1;
        } while (lVar6 < local_144);
      }
      if (iVar2 == 2) {
        if (outputflag != OUTPUT_NONE) {
          cmProcessOutput::DecodeText(&local_151,local_140,(long)local_144,&local_138,1);
          Stdout(local_138._M_dataplus._M_p,local_138._M_string_length);
        }
        if (captureStdOut != (string *)0x0) {
          std::vector<char,std::allocator<char>>::_M_range_insert<char*>
                    ((vector<char,std::allocator<char>> *)&local_d8,uStack_d0);
        }
      }
      else if (iVar2 == 3) {
        if (outputflag != OUTPUT_NONE) {
          cmProcessOutput::DecodeText(&local_151,local_140,(long)local_144,&local_138,2);
          Stderr(local_138._M_dataplus._M_p,local_138._M_string_length);
        }
        if ((char)local_150 != '\0') {
          std::vector<char,std::allocator<char>>::_M_range_insert<char*>
                    ((vector<char,std::allocator<char>> *)&local_f8,uStack_f0);
        }
      }
    }
    if (outputflag != OUTPUT_NONE) {
      local_50._M_string_length = 0;
      local_50.field_2._M_local_buf[0] = '\0';
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      cmProcessOutput::DecodeText(&local_151,&local_50,&local_138,1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,
                        CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                                 local_50.field_2._M_local_buf[0]) + 1);
      }
      if (local_138._M_string_length != 0) {
        Stdout(local_138._M_dataplus._M_p,local_138._M_string_length);
      }
      local_70._M_string_length = 0;
      local_70.field_2._M_local_buf[0] = '\0';
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      cmProcessOutput::DecodeText(&local_151,&local_70,&local_138,2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,
                        CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                                 local_70.field_2._M_local_buf[0]) + 1);
      }
      if (local_138._M_string_length != 0) {
        Stderr(local_138._M_dataplus._M_p,local_138._M_string_length);
      }
    }
  }
  cmsysProcess_WaitForExit(cp,(double *)0x0);
  if (captureStdOut != (string *)0x0) {
    pcVar1 = (captureStdOut->_M_dataplus)._M_p;
    std::__cxx11::string::
    _M_replace_dispatch<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
              ((string *)captureStdOut,pcVar1,pcVar1 + captureStdOut->_M_string_length,local_d8,
               uStack_d0);
    pcVar1 = (captureStdOut->_M_dataplus)._M_p;
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_90,pcVar1,pcVar1 + captureStdOut->_M_string_length);
    cmProcessOutput::DecodeText(&local_151,&local_90,captureStdOut,0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
  }
  if ((char)local_150 != '\0') {
    pcVar1 = (captureStdErr->_M_dataplus)._M_p;
    std::__cxx11::string::
    _M_replace_dispatch<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
              ((string *)captureStdErr,pcVar1,pcVar1 + captureStdErr->_M_string_length,local_f8,
               uStack_f0);
    pcVar1 = (captureStdErr->_M_dataplus)._M_p;
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b0,pcVar1,pcVar1 + captureStdErr->_M_string_length);
    cmProcessOutput::DecodeText(&local_151,&local_b0,captureStdErr,0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
  }
  iVar2 = cmsysProcess_GetState(cp);
  if (iVar2 == 4) {
    if (local_b8 == (int *)0x0) {
      iVar2 = cmsysProcess_GetExitValue(cp);
      bVar8 = iVar2 == 0;
    }
    else {
      iVar2 = cmsysProcess_GetExitValue(cp);
      *local_b8 = iVar2;
      bVar8 = true;
    }
  }
  else {
    iVar2 = cmsysProcess_GetState(cp);
    if (iVar2 == 2) {
      pcVar4 = cmsysProcess_GetExceptionString(cp);
      if (outputflag != OUTPUT_NONE) {
        if (pcVar4 == (char *)0x0) {
          std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x691360);
        }
        else {
          sVar5 = strlen(pcVar4);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar4,sVar5);
        }
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '`');
        std::ostream::put('`');
        std::ostream::flush();
      }
      if ((char)local_150 != '\0') {
        strlen(pcVar4);
        std::__cxx11::string::append((char *)captureStdErr,(ulong)pcVar4);
      }
    }
    else {
      iVar2 = cmsysProcess_GetState(cp);
      if (iVar2 == 1) {
        pcVar4 = cmsysProcess_GetErrorString(cp);
        if (outputflag != OUTPUT_NONE) {
          if (pcVar4 == (char *)0x0) {
            std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x691360);
          }
          else {
            sVar5 = strlen(pcVar4);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar4,sVar5);
          }
          std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '`');
          std::ostream::put('`');
          std::ostream::flush();
        }
        if ((char)local_150 != '\0') {
          strlen(pcVar4);
          std::__cxx11::string::append((char *)captureStdErr,(ulong)pcVar4);
        }
      }
      else {
        iVar2 = cmsysProcess_GetState(cp);
        bVar8 = true;
        if (iVar2 != 5) goto LAB_0026f876;
        if (outputflag != OUTPUT_NONE) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Process terminated due to timeout\n",0x22);
          std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '`');
          std::ostream::put('`');
          std::ostream::flush();
        }
        if ((char)local_150 != '\0') {
          std::__cxx11::string::append((char *)captureStdErr,0x553913);
        }
      }
    }
    bVar8 = false;
  }
LAB_0026f876:
  cmsysProcess_Delete(cp);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,
                    CONCAT71(local_138.field_2._M_allocated_capacity._1_7_,
                             local_138.field_2._M_local_buf[0]) + 1);
  }
  cmProcessOutput::~cmProcessOutput(&local_151);
  if (local_f8 != (void *)0x0) {
    operator_delete(local_f8,local_e8 - (long)local_f8);
  }
  if (local_d8 != (void *)0x0) {
    operator_delete(local_d8,local_c8 - (long)local_d8);
  }
  if (local_118 != (char **)0x0) {
    operator_delete(local_118,(long)local_108 - (long)local_118);
  }
  return bVar8;
}

Assistant:

bool cmSystemTools::RunSingleCommand(std::vector<std::string> const& command,
                                     std::string* captureStdOut,
                                     std::string* captureStdErr, int* retVal,
                                     const char* dir, OutputOption outputflag,
                                     double timeout, Encoding encoding)
{
  std::vector<const char*> argv;
  for (std::vector<std::string>::const_iterator a = command.begin();
       a != command.end(); ++a) {
    argv.push_back(a->c_str());
  }
  argv.push_back(CM_NULLPTR);

  cmsysProcess* cp = cmsysProcess_New();
  cmsysProcess_SetCommand(cp, &*argv.begin());
  cmsysProcess_SetWorkingDirectory(cp, dir);
  if (cmSystemTools::GetRunCommandHideConsole()) {
    cmsysProcess_SetOption(cp, cmsysProcess_Option_HideWindow, 1);
  }

  if (outputflag == OUTPUT_PASSTHROUGH) {
    cmsysProcess_SetPipeShared(cp, cmsysProcess_Pipe_STDOUT, 1);
    cmsysProcess_SetPipeShared(cp, cmsysProcess_Pipe_STDERR, 1);
    captureStdOut = CM_NULLPTR;
    captureStdErr = CM_NULLPTR;
  } else if (outputflag == OUTPUT_MERGE ||
             (captureStdErr && captureStdErr == captureStdOut)) {
    cmsysProcess_SetOption(cp, cmsysProcess_Option_MergeOutput, 1);
    captureStdErr = CM_NULLPTR;
  }
  assert(!captureStdErr || captureStdErr != captureStdOut);

  cmsysProcess_SetTimeout(cp, timeout);
  cmsysProcess_Execute(cp);

  std::vector<char> tempStdOut;
  std::vector<char> tempStdErr;
  char* data;
  int length;
  int pipe;
  cmProcessOutput processOutput(encoding);
  std::string strdata;
  if (outputflag != OUTPUT_PASSTHROUGH &&
      (captureStdOut || captureStdErr || outputflag != OUTPUT_NONE)) {
    while ((pipe = cmsysProcess_WaitForData(cp, &data, &length, CM_NULLPTR)) >
           0) {
      // Translate NULL characters in the output into valid text.
      for (int i = 0; i < length; ++i) {
        if (data[i] == '\0') {
          data[i] = ' ';
        }
      }

      if (pipe == cmsysProcess_Pipe_STDOUT) {
        if (outputflag != OUTPUT_NONE) {
          processOutput.DecodeText(data, length, strdata, 1);
          cmSystemTools::Stdout(strdata.c_str(), strdata.size());
        }
        if (captureStdOut) {
          tempStdOut.insert(tempStdOut.end(), data, data + length);
        }
      } else if (pipe == cmsysProcess_Pipe_STDERR) {
        if (outputflag != OUTPUT_NONE) {
          processOutput.DecodeText(data, length, strdata, 2);
          cmSystemTools::Stderr(strdata.c_str(), strdata.size());
        }
        if (captureStdErr) {
          tempStdErr.insert(tempStdErr.end(), data, data + length);
        }
      }
    }

    if (outputflag != OUTPUT_NONE) {
      processOutput.DecodeText(std::string(), strdata, 1);
      if (!strdata.empty()) {
        cmSystemTools::Stdout(strdata.c_str(), strdata.size());
      }
      processOutput.DecodeText(std::string(), strdata, 2);
      if (!strdata.empty()) {
        cmSystemTools::Stderr(strdata.c_str(), strdata.size());
      }
    }
  }

  cmsysProcess_WaitForExit(cp, CM_NULLPTR);

  if (captureStdOut) {
    captureStdOut->assign(tempStdOut.begin(), tempStdOut.end());
    processOutput.DecodeText(*captureStdOut, *captureStdOut);
  }
  if (captureStdErr) {
    captureStdErr->assign(tempStdErr.begin(), tempStdErr.end());
    processOutput.DecodeText(*captureStdErr, *captureStdErr);
  }

  bool result = true;
  if (cmsysProcess_GetState(cp) == cmsysProcess_State_Exited) {
    if (retVal) {
      *retVal = cmsysProcess_GetExitValue(cp);
    } else {
      if (cmsysProcess_GetExitValue(cp) != 0) {
        result = false;
      }
    }
  } else if (cmsysProcess_GetState(cp) == cmsysProcess_State_Exception) {
    const char* exception_str = cmsysProcess_GetExceptionString(cp);
    if (outputflag != OUTPUT_NONE) {
      std::cerr << exception_str << std::endl;
    }
    if (captureStdErr) {
      captureStdErr->append(exception_str, strlen(exception_str));
    }
    result = false;
  } else if (cmsysProcess_GetState(cp) == cmsysProcess_State_Error) {
    const char* error_str = cmsysProcess_GetErrorString(cp);
    if (outputflag != OUTPUT_NONE) {
      std::cerr << error_str << std::endl;
    }
    if (captureStdErr) {
      captureStdErr->append(error_str, strlen(error_str));
    }
    result = false;
  } else if (cmsysProcess_GetState(cp) == cmsysProcess_State_Expired) {
    const char* error_str = "Process terminated due to timeout\n";
    if (outputflag != OUTPUT_NONE) {
      std::cerr << error_str << std::endl;
    }
    if (captureStdErr) {
      captureStdErr->append(error_str, strlen(error_str));
    }
    result = false;
  }

  cmsysProcess_Delete(cp);
  return result;
}